

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GammaHandler.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
GammaHandler::combineSpectra
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GammaHandler *this,
          double emin,double emax,string *source)

{
  value_type vVar1;
  double dVar2;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  double dVar3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__x;
  RandomGen *pRVar4;
  reference pvVar5;
  allocator<double> local_109;
  double local_108 [3];
  iterator local_f0;
  size_type local_e8;
  undefined1 local_d9;
  vector<double,_std::allocator<double>_> local_d8;
  allocator<double> local_bd [13];
  double local_b0;
  double local_a8;
  undefined8 local_a0;
  iterator local_98;
  size_type local_90;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> xyTry;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  sourceInfo;
  double pp;
  double compton;
  double pe;
  double fValue;
  double brSum;
  string *source_local;
  double emax_local;
  double emin_local;
  GammaHandler *this_local;
  vector<double,_std::allocator<double>_> *keV_vec;
  
  compton = 0.0;
  pp = 0.0;
  sourceInfo.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = sourceLookupTable(this,source);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,__x);
  pRVar4 = RandomGen::rndm();
  dVar2 = RandomGen::rand_uniform(pRVar4);
  dVar3 = yMax;
  local_b0 = (emax - emin) * dVar2 + emin;
  pRVar4 = RandomGen::rndm();
  local_a8 = RandomGen::rand_uniform(pRVar4);
  local_a8 = dVar3 * local_a8;
  local_a0 = 0x3ff0000000000000;
  local_98 = &local_b0;
  local_90 = 3;
  std::allocator<double>::allocator(local_bd);
  __l_00._M_len = local_90;
  __l_00._M_array = local_98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_88,__l_00,local_bd);
  std::allocator<double>::~allocator(local_bd);
  while (pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_88,2), 0.0 < *pvVar5)
  {
    compton = photoIonization(this,(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    *)&xyTry.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_88);
    pp = GammaHandler::compton
                   (this,(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)&xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                    (vector<double,_std::allocator<double>_> *)local_88);
    sourceInfo.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)pairProduction(this,(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       *)&xyTry.super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (vector<double,_std::allocator<double>_> *)local_88);
    pRVar4 = RandomGen::rndm();
    dVar3 = yMax;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,0);
    dVar2 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,1);
    RandomGen::VonNeumann
              (&local_d8,pRVar4,emin,emax,0.0,dVar3,dVar2,*pvVar5,
               compton + pp +
               (double)sourceInfo.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_88,&local_d8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_d8);
  }
  local_d9 = 0;
  local_108[2] = -1.0;
  local_108[0] = -1.0;
  local_108[1] = -1.0;
  local_f0 = local_108;
  local_e8 = 3;
  std::allocator<double>::allocator(&local_109);
  __l._M_len = local_e8;
  __l._M_array = local_f0;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l,&local_109);
  std::allocator<double>::~allocator(&local_109);
  if (0.0 < compton) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,0);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
    *pvVar5 = vVar1;
  }
  if (0.0 < pp) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,0);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
    *pvVar5 = vVar1;
  }
  if (0.0 < (double)sourceInfo.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,0);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
    *pvVar5 = vVar1;
  }
  local_d9 = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_88);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

const vector<double> GammaHandler::combineSpectra(double emin, double emax,
                                                  string source) {
  double brSum = 0.0;
  double fValue = 0.0;
  double pe = 0.0;
  double compton = 0.0;
  double pp = 0.0;

  vector<vector<double>> sourceInfo = GammaHandler::sourceLookupTable(source);

  vector<double> xyTry = {
      emin + (emax - emin) * RandomGen::rndm()->rand_uniform(),
      yMax * RandomGen::rndm()->rand_uniform(), 1.};

  while (xyTry[2] > 0.) {
    pe = GammaHandler::photoIonization(sourceInfo, xyTry);
    compton = GammaHandler::compton(sourceInfo, xyTry);
    pp = GammaHandler::pairProduction(sourceInfo, xyTry);
    fValue = pe + compton + pp;
    xyTry = RandomGen::rndm()->VonNeumann(emin, emax, 0., yMax, xyTry[0],
                                          xyTry[1], fValue);
  }

  vector<double> keV_vec = {-1, -1, -1};

  if (pe > 0.0) {
    keV_vec[0] = xyTry[0];
  }
  if (compton > 0.0) {
    keV_vec[1] = xyTry[0];
  }
  if (pp > 0.0) {
    keV_vec[2] = xyTry[0];
  }
  return keV_vec;
}